

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_close.c
# Opt level: O0

int real_close_for_test(int fd)

{
  int iVar1;
  code *pcVar2;
  char *local_38;
  _func_int_int *real_close;
  char *libname;
  Link_map *link_map;
  void *libc_handle;
  int fd_local;
  
  libc_handle._4_4_ = fd;
  link_map = (Link_map *)dlopen(0,2);
  if (link_map == (Link_map *)0x0) {
    abort();
  }
  iVar1 = dlinfo(link_map,2,&libname);
  if (iVar1 < 0) {
    abort();
  }
  link_map = (Link_map *)0x0;
  do {
    if (libname == (char *)0x0) {
LAB_0010d037:
      if (link_map == (Link_map *)0x0) {
        abort();
      }
      pcVar2 = (code *)dlsym(link_map,"close");
      if (pcVar2 == (code *)0x0) {
        abort();
      }
      iVar1 = (*pcVar2)(libc_handle._4_4_);
      return iVar1;
    }
    local_38 = strrchr(*(char **)(libname + 8),0x2f);
    if (local_38 == (char *)0x0) {
      local_38 = *(char **)(libname + 8);
    }
    else {
      local_38 = local_38 + 1;
    }
    iVar1 = strncmp(local_38,"libc.so",7);
    if (iVar1 == 0) {
      link_map = (Link_map *)dlopen(local_38,1);
      goto LAB_0010d037;
    }
    libname = *(char **)(libname + 0x18);
  } while( true );
}

Assistant:

int
real_close_for_test(int fd)
{
#if defined(__APPLE__)
	return close(fd);
#else
	void *libc_handle;

#if defined(__OpenBSD__)
	struct r_debug *r_debug = NULL;
	for (Elf_Dyn *dyn = _DYNAMIC; dyn->d_tag != DT_NULL; ++dyn) {
		if (dyn->d_tag == DT_DEBUG) {
			r_debug = (struct r_debug *)dyn->d_un.d_ptr;
			break;
		}
	}
	if (!r_debug) {
		abort();
	}
	struct link_map *link_map = r_debug->r_map;
#else
	if ((libc_handle = dlopen(NULL, RTLD_NOW)) == NULL) {
		abort();
	}

#ifdef __linux__
	typedef struct link_map Link_map;
#endif

	Link_map *link_map;
	if (dlinfo(libc_handle, RTLD_DI_LINKMAP, &link_map) < 0) {
		abort();
	}
#endif

	libc_handle = NULL;
	for (; link_map != NULL; link_map = link_map->l_next) {
		char const *libname = strrchr(link_map->l_name, '/');
		libname = libname == NULL ? link_map->l_name : libname + 1;

		if (strncmp(libname, "libc.so", strlen("libc.so")) == 0) {
			libc_handle = dlopen(libname, RTLD_LAZY);
			break;
		}
	}
	if (libc_handle == NULL) {
		abort();
	}

	typeof(close) *real_close = dlsym(libc_handle, "close");
	if (real_close == NULL) {
		abort();
	}

	return real_close(fd);
#endif
}